

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

VisitReturn __thiscall
QMakeEvaluator::evaluateFileInto
          (QMakeEvaluator *this,QString *fileName,ProValueMap *values,LoadFlags flags)

{
  long lVar1;
  bool bVar2;
  VisitReturn VVar3;
  QList<ProString> *this_00;
  ProString *ifn;
  ProString *str;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<ProString> local_358;
  QArrayDataPointer<ProString> local_338;
  ProKey qiif;
  QMakeEvaluator visitor;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&visitor,0xaa,0x2b0);
  QMakeEvaluator(&visitor,this->m_option,this->m_parser,this->m_vfs,this->m_handler);
  visitor.m_caller = this;
  QString::operator=(&visitor.m_outputDir,(QString *)&this->m_outputDir);
  QExplicitlySharedDataPointer<QMakeFeatureRoots>::operator=
            (&visitor.m_featureRoots,&this->m_featureRoots);
  VVar3 = evaluateFileChecked(&visitor,fileName,EvalAuxFile,flags);
  if (VVar3 == ReturnTrue) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
    ::operator=(&values->d,
                (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                 *)(visitor.m_valuemapStack.
                    super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                    .
                    super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev + 1));
    qiif.super_ProString.m_file = -0x55555556;
    qiif.super_ProString._36_4_ = 0xaaaaaaaa;
    qiif.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
    qiif.super_ProString.m_string.d.size = -0x5555555555555556;
    qiif.super_ProString.m_offset = -0x55555556;
    qiif.super_ProString.m_length = -0x55555556;
    qiif.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    qiif.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey(&qiif,"QMAKE_INTERNAL_INCLUDED_FILES");
    this_00 = &QMap<ProKey,_ProStringList>::operator[]
                         ((QMap<ProKey,_ProStringList> *)
                          ((this->m_valuemapStack).
                           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                           .
                           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                           ._M_impl._M_node.super__List_node_base._M_next + 1),&qiif)->
               super_QList<ProString>;
    local_338.size = -0x5555555555555556;
    local_338.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_338.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_358.d = (Data *)0x0;
    local_358.ptr = (ProString *)0x0;
    local_358.size = 0;
    QMap<ProKey,_ProStringList>::value
              ((ProStringList *)&local_338,values,&qiif,(ProStringList *)&local_358);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_358);
    VVar3 = ReturnTrue;
    str = local_338.ptr;
    for (lVar4 = local_338.size * 0x30; lVar4 != 0; lVar4 = lVar4 + -0x30) {
      bVar2 = ProStringList::contains((ProStringList *)this_00,str,CaseSensitive);
      if (!bVar2) {
        QList<ProString>::emplaceBack<ProString_const&>(this_00,str);
      }
      str = str + 1;
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_338);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&qiif);
  }
  ~QMakeEvaluator(&visitor);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return VVar3;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateFileInto(
        const QString &fileName, ProValueMap *values, LoadFlags flags)
{
    QMakeEvaluator visitor(m_option, m_parser, m_vfs, m_handler);
    visitor.m_caller = this;
    visitor.m_outputDir = m_outputDir;
    visitor.m_featureRoots = m_featureRoots;
    VisitReturn ret = visitor.evaluateFileChecked(fileName, QMakeHandler::EvalAuxFile, flags);
    if (ret != ReturnTrue)
        return ret;
    *values = visitor.m_valuemapStack.top();
    ProKey qiif("QMAKE_INTERNAL_INCLUDED_FILES");
    ProStringList &iif = m_valuemapStack.front()[qiif];
    const auto ifns = values->value(qiif);
    for (const ProString &ifn : ifns)
        if (!iif.contains(ifn))
            iif << ifn;
    return ReturnTrue;
}